

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O1

void __thiscall
helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_add_order_mpid *m)

{
  order_book *this_00;
  uint uVar1;
  uint uVar2;
  uint64_t uVar3;
  order order;
  undefined1 auVar4 [24];
  side_type sVar5;
  undefined8 uVar6;
  __hash_code __code;
  _Hash_node_base *p_Var7;
  ulong uVar8;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  ulong uVar11;
  _Hash_node_base *p_Var12;
  undefined7 uStack_7f;
  event local_70;
  
  p_Var7 = (_Hash_node_base *)(ulong)m->StockLocate;
  uVar11 = (this->order_book_id_map)._M_h._M_bucket_count;
  uVar8 = (ulong)p_Var7 % uVar11;
  p_Var9 = (this->order_book_id_map)._M_h._M_buckets[uVar8 & 0xffffffff];
  p_Var10 = (__node_base_ptr)0x0;
  if ((p_Var9 != (__node_base_ptr)0x0) &&
     (p_Var12 = p_Var9->_M_nxt, p_Var10 = p_Var9, p_Var9->_M_nxt[1]._M_nxt != p_Var7)) {
    while (p_Var9 = p_Var12, p_Var12 = p_Var9->_M_nxt, p_Var12 != (_Hash_node_base *)0x0) {
      p_Var10 = (__node_base_ptr)0x0;
      if (((ulong)p_Var12[1]._M_nxt % uVar11 != uVar8) ||
         (p_Var10 = p_Var9, p_Var12[1]._M_nxt == p_Var7)) goto LAB_00113be9;
    }
    p_Var10 = (__node_base_ptr)0x0;
  }
LAB_00113be9:
  if (p_Var10 == (__node_base_ptr)0x0) {
    p_Var7 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var7 = p_Var10->_M_nxt;
  }
  if (p_Var7 != (_Hash_node_base *)0x0) {
    this_00 = (order_book *)(p_Var7 + 2);
    uVar3 = m->OrderReferenceNumber;
    uVar1 = m->Price;
    uVar2 = m->Shares;
    sVar5 = itch50_side(m->BuySellIndicator);
    uVar11 = (ulong)*(ushort *)&m->field_0x9 << 0x20;
    uVar8 = (ulong)*(uint6 *)&m->field_0x5;
    p_Var12 = (_Hash_node_base *)
              (((uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28 |
               uVar8 << 0x38) >> 0x10);
    order._33_7_ = uStack_7f;
    order.side = sVar5;
    auVar4 = ZEXT1224(CONCAT48(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                               uVar1 << 0x18,uVar3)) << 0x40;
    order.quantity._0_4_ =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    order.level = (price_level *)auVar4._0_8_;
    order.id = auVar4._8_8_;
    order.price = auVar4._16_8_;
    order.quantity._4_4_ = 0;
    order.timestamp = (uint64_t)p_Var12;
    order_book::add(this_00,order);
    p_Var7[6]._M_nxt = p_Var12;
    make_ob_event(&local_70,(string *)this_00,(uint64_t)p_Var12,this_00,0);
    if ((this->_process_event).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar6 = std::__throw_bad_function_call();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._symbol._M_dataplus._M_p != &local_70._symbol.field_2) {
        operator_delete(local_70._symbol._M_dataplus._M_p,
                        local_70._symbol.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar6);
    }
    (*(this->_process_event)._M_invoker)((_Any_data *)this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._symbol._M_dataplus._M_p != &local_70._symbol.field_2) {
      operator_delete(local_70._symbol._M_dataplus._M_p,
                      local_70._symbol.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_add_order_mpid* m)
{
    auto it = order_book_id_map.find(m->StockLocate);
    if (it != order_book_id_map.end()) {
        auto& ob = it->second;

        uint64_t order_id = m->OrderReferenceNumber;
        uint64_t price    = be32toh(m->Price);
        uint32_t quantity = be32toh(m->Shares);
        auto     side     = itch50_side(m->BuySellIndicator);
        uint64_t timestamp = itch50_timestamp(m->Timestamp);
        order o{order_id, price, quantity, side, timestamp};
        ob.add(std::move(o));
        ob.set_timestamp(timestamp);
        _process_event(make_ob_event(ob.symbol(), timestamp, &ob));
    }
}